

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kitFactor.c
# Opt level: O0

Kit_Edge_t Kit_SopFactorTrivialCube_rec(Kit_Graph_t *pFForm,uint uCube,int nStart,int nFinish)

{
  int iVar1;
  int iVar2;
  Kit_Edge_t eEdge0;
  Kit_Edge_t eEdge1;
  int nLits2;
  int nLits1;
  int nLits;
  int iLit;
  int i;
  Kit_Edge_t eNode2;
  Kit_Edge_t eNode1;
  int nFinish_local;
  int nStart_local;
  uint uCube_local;
  Kit_Graph_t *pFForm_local;
  
  nLits1 = -1;
  if (uCube == 0) {
    __assert_fail("uCube",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/bool/kit/kitFactor.c"
                  ,0xcb,
                  "Kit_Edge_t Kit_SopFactorTrivialCube_rec(Kit_Graph_t *, unsigned int, int, int)");
  }
  nLits2 = 0;
  for (nLits = nStart; nLits < nFinish; nLits = nLits + 1) {
    iVar1 = Kit_CubeHasLit(uCube,nLits);
    if (iVar1 != 0) {
      nLits1 = nLits;
      nLits2 = nLits2 + 1;
    }
  }
  if (nLits1 == -1) {
    __assert_fail("iLit != -1",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/bool/kit/kitFactor.c"
                  ,0xd4,
                  "Kit_Edge_t Kit_SopFactorTrivialCube_rec(Kit_Graph_t *, unsigned int, int, int)");
  }
  if (nLits2 == 1) {
    pFForm_local._4_4_ = Kit_EdgeCreate(nLits1 / 2,nLits1 % 2);
  }
  else {
    iVar1 = nLits2 / 2;
    nLits2 = 0;
    for (nLits = nStart; nLits < nFinish; nLits = nLits + 1) {
      iVar2 = Kit_CubeHasLit(uCube,nLits);
      if (iVar2 != 0) {
        if (nLits2 == iVar1) break;
        nLits2 = nLits2 + 1;
      }
    }
    eEdge0 = Kit_SopFactorTrivialCube_rec(pFForm,uCube,nStart,nLits);
    eEdge1 = Kit_SopFactorTrivialCube_rec(pFForm,uCube,nLits,nFinish);
    pFForm_local._4_4_ = Kit_GraphAddNodeAnd(pFForm,eEdge0,eEdge1);
  }
  return pFForm_local._4_4_;
}

Assistant:

Kit_Edge_t Kit_SopFactorTrivialCube_rec( Kit_Graph_t * pFForm, unsigned uCube, int nStart, int nFinish )
{
    Kit_Edge_t eNode1, eNode2;
    int i, iLit = -1, nLits, nLits1, nLits2;
    assert( uCube );
    // count the number of literals in this interval
    nLits = 0;
    for ( i = nStart; i < nFinish; i++ )
        if ( Kit_CubeHasLit(uCube, i) )
        {
            iLit = i;
            nLits++;
        }
    assert( iLit != -1 );
    // quit if there is only one literal        
    if ( nLits == 1 )
        return Kit_EdgeCreate( iLit/2, iLit%2 ); // CST
    // split the literals into two parts
    nLits1 = nLits/2;
    nLits2 = nLits - nLits1;
//    nLits2 = nLits/2;
//    nLits1 = nLits - nLits2;
    // find the splitting point
    nLits = 0;
    for ( i = nStart; i < nFinish; i++ )
        if ( Kit_CubeHasLit(uCube, i) )
        {
            if ( nLits == nLits1 )
                break;
            nLits++;
        }
    // recursively construct the tree for the parts
    eNode1 = Kit_SopFactorTrivialCube_rec( pFForm, uCube, nStart, i  );
    eNode2 = Kit_SopFactorTrivialCube_rec( pFForm, uCube, i, nFinish );
    return Kit_GraphAddNodeAnd( pFForm, eNode1, eNode2 );
}